

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

void finish_output_bmp(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  FILE *__stream;
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  j_decompress_ptr in_RSI;
  long *in_RDI;
  cd_progress_ptr progress;
  j_decompress_ptr in_stack_00000010;
  JDIMENSION row;
  JSAMPROW data_ptr;
  JSAMPARRAY image_ptr;
  FILE *outfile;
  bmp_dest_ptr dest;
  int local_34;
  
  __stream = *(FILE **)&in_RSI->is_decompressor;
  puVar1 = (undefined8 *)in_RDI[2];
  if (in_RSI->buffered_image != 0) {
    if (in_RSI->num_components == 0) {
      write_bmp_header(in_stack_00000010,(bmp_dest_ptr)progress);
    }
    else {
      write_os2_header(in_RSI,(bmp_dest_ptr)in_RSI);
    }
    for (local_34 = *(int *)((long)in_RDI + 0x8c); local_34 != 0; local_34 = local_34 + -1) {
      if (puVar1 != (undefined8 *)0x0) {
        puVar1[1] = (ulong)(uint)(*(int *)((long)in_RDI + 0x8c) - local_34);
        puVar1[2] = (ulong)*(uint *)((long)in_RDI + 0x8c);
        (*(code *)*puVar1)(in_RDI);
      }
      uVar2._0_4_ = in_RSI->out_color_space;
      uVar2._4_4_ = in_RSI->scale_num;
      puVar4 = (undefined8 *)(**(code **)(in_RDI[1] + 0x38))(in_RDI,uVar2,local_34 + -1,1,0);
      fwrite((void *)*puVar4,1,(ulong)*(uint *)&in_RSI->field_0x4c,__stream);
    }
    if (puVar1 != (undefined8 *)0x0) {
      *(int *)(puVar1 + 4) = *(int *)(puVar1 + 4) + 1;
    }
  }
  fflush(__stream);
  iVar3 = ferror(__stream);
  if (iVar3 != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
finish_output_bmp(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;
  register FILE *outfile = dest->pub.output_file;
  JSAMPARRAY image_ptr;
  register JSAMPROW data_ptr;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  if (dest->use_inversion_array) {
    /* Write the header and colormap */
    if (dest->is_os2)
      write_os2_header(cinfo, dest);
    else
      write_bmp_header(cinfo, dest);

    /* Write the file body from our virtual array */
    for (row = cinfo->output_height; row > 0; row--) {
      if (progress != NULL) {
        progress->pub.pass_counter = (long)(cinfo->output_height - row);
        progress->pub.pass_limit = (long)cinfo->output_height;
        (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
      }
      image_ptr = (*cinfo->mem->access_virt_sarray)
        ((j_common_ptr)cinfo, dest->whole_image, row - 1, (JDIMENSION)1,
         FALSE);
      data_ptr = image_ptr[0];
      (void)JFWRITE(outfile, data_ptr, dest->row_width);
    }
    if (progress != NULL)
      progress->completed_extra_passes++;
  }

  /* Make sure we wrote the output file OK */
  fflush(outfile);
  if (ferror(outfile))
    ERREXIT(cinfo, JERR_FILE_WRITE);
}